

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kepler.c
# Opt level: O0

int SolveProblem(ProgramArgs *args,ProblemResult *result,SUNContext sunctx)

{
  FILE *pFVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  int *in_RDI;
  double dVar4;
  sunrealtype sVar5;
  sunrealtype sVar6;
  sunrealtype sVar7;
  sunrealtype L0;
  sunrealtype H0;
  sunrealtype tout;
  sunrealtype tret;
  char fname_1 [256];
  char *fmt3_1;
  char *fmt2_1;
  char *fmt1_1;
  char fname [256];
  char *fmt3;
  char *fmt2;
  char *fmt1;
  sunrealtype ecc;
  sunrealtype dTout;
  sunrealtype T0;
  sunrealtype Tf;
  sunrealtype dt;
  char *method_name;
  int num_output_times;
  int use_compsums;
  int stepper;
  int step_mode;
  int count_orbits;
  int retval;
  int iout;
  int rootsfound;
  FILE *times_fp;
  FILE *solution_fp;
  FILE *conserved_fp;
  sunrealtype num_orbits;
  sunrealtype *ydata;
  UserData udata;
  SUNNonlinearSolver NLS;
  N_Vector y;
  void *arkode_mem;
  int in_stack_fffffffffffffb5c;
  undefined2 in_stack_fffffffffffffb60;
  undefined6 in_stack_fffffffffffffb62;
  void *in_stack_fffffffffffffb68;
  undefined2 in_stack_fffffffffffffb70;
  undefined6 in_stack_fffffffffffffb72;
  sunrealtype in_stack_fffffffffffffb78;
  undefined2 in_stack_fffffffffffffb80;
  undefined2 uVar8;
  undefined6 in_stack_fffffffffffffb82;
  double local_470;
  double local_400;
  double local_308;
  undefined8 local_300;
  char local_2f8 [264];
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char local_1d8 [264];
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined8 local_b8;
  double local_b0;
  undefined8 local_a8;
  double local_a0;
  double local_98;
  undefined8 local_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  uint local_6c;
  FILE *local_68;
  FILE *local_60;
  FILE *local_58;
  double local_50;
  undefined8 local_48;
  undefined8 *local_40;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  int *local_10;
  
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_40 = (undefined8 *)0x0;
  local_48 = 0;
  local_50 = 0.0;
  local_58 = (FILE *)0x0;
  local_60 = (FILE *)0x0;
  local_68 = (FILE *)0x0;
  local_6c = 0;
  local_70 = 0;
  local_74 = 0;
  local_78 = in_RDI[5];
  local_7c = *in_RDI;
  local_80 = in_RDI[1];
  local_84 = in_RDI[3];
  local_88 = in_RDI[2];
  local_90 = *(undefined8 *)(in_RDI + 0xc);
  local_98 = *(double *)(in_RDI + 8);
  local_a0 = *(double *)(in_RDI + 10);
  local_a8 = 0;
  local_b0 = (local_a0 - 0.0) / (double)local_88;
  local_b8 = 0x3fe3333333333333;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  printf("\n   Begin Kepler Problem\n\n");
  PrintArgs((ProgramArgs *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70));
  local_40 = (undefined8 *)malloc(8);
  *local_40 = 0x3fe3333333333333;
  local_30 = N_VNew_Serial(4,local_20);
  local_48 = N_VGetArrayPointer(local_30);
  InitialConditions((N_Vector)CONCAT62(in_stack_fffffffffffffb82,in_stack_fffffffffffffb80),
                    in_stack_fffffffffffffb78);
  if (local_80 == 0) {
    local_28 = SPRKStepCreate(0,force,velocity,local_30,local_20);
    if (local_78 != 0) {
      ARKodeRootInit(local_28,1,rootfn);
      iVar3 = check_retval(in_stack_fffffffffffffb68,
                           (char *)CONCAT62(in_stack_fffffffffffffb62,in_stack_fffffffffffffb60),
                           in_stack_fffffffffffffb5c);
      if (iVar3 != 0) {
        return 1;
      }
    }
    local_74 = SPRKStepSetMethodName(local_28,local_90);
    iVar3 = check_retval(in_stack_fffffffffffffb68,
                         (char *)CONCAT62(in_stack_fffffffffffffb62,in_stack_fffffffffffffb60),
                         in_stack_fffffffffffffb5c);
    if (iVar3 != 0) {
      return 1;
    }
    local_74 = SPRKStepSetUseCompensatedSums(local_28,local_84);
    iVar3 = check_retval(in_stack_fffffffffffffb68,
                         (char *)CONCAT62(in_stack_fffffffffffffb62,in_stack_fffffffffffffb60),
                         in_stack_fffffffffffffb5c);
    if (iVar3 != 0) {
      return 1;
    }
    if (local_7c != 0) {
      fprintf(_stderr,"ERROR: adaptive time-steps are not supported with SPRKStep\n");
      return 1;
    }
    local_74 = ARKodeSetFixedStep(local_98,local_28);
    iVar3 = check_retval(in_stack_fffffffffffffb68,
                         (char *)CONCAT62(in_stack_fffffffffffffb62,in_stack_fffffffffffffb60),
                         in_stack_fffffffffffffb5c);
    uVar2 = local_28;
    if (iVar3 != 0) {
      return 1;
    }
    dVar4 = ceil(local_a0 / local_98);
    local_74 = ARKodeSetMaxNumSteps(uVar2,(long)dVar4 + 1);
    iVar3 = check_retval(in_stack_fffffffffffffb68,
                         (char *)CONCAT62(in_stack_fffffffffffffb62,in_stack_fffffffffffffb60),
                         in_stack_fffffffffffffb5c);
    if (iVar3 != 0) {
      return 1;
    }
    local_74 = ARKodeSetUserData(local_28,local_40);
    iVar3 = check_retval(in_stack_fffffffffffffb68,
                         (char *)CONCAT62(in_stack_fffffffffffffb62,in_stack_fffffffffffffb60),
                         in_stack_fffffffffffffb5c);
    if (iVar3 != 0) {
      return 1;
    }
  }
  else if (local_80 == 1) {
    local_28 = ARKStepCreate(0,dydt,0,local_30,local_20);
    local_74 = ARKStepSetTableName(local_28,"ARKODE_DIRK_NONE",local_90);
    iVar3 = check_retval(in_stack_fffffffffffffb68,
                         (char *)CONCAT62(in_stack_fffffffffffffb62,in_stack_fffffffffffffb60),
                         in_stack_fffffffffffffb5c);
    if (iVar3 != 0) {
      return 1;
    }
    if (local_78 != 0) {
      ARKodeRootInit(local_28,1,rootfn);
      iVar3 = check_retval(in_stack_fffffffffffffb68,
                           (char *)CONCAT62(in_stack_fffffffffffffb62,in_stack_fffffffffffffb60),
                           in_stack_fffffffffffffb5c);
      if (iVar3 != 0) {
        return 1;
      }
    }
    local_74 = ARKodeSetUserData(local_28,local_40);
    iVar3 = check_retval(in_stack_fffffffffffffb68,
                         (char *)CONCAT62(in_stack_fffffffffffffb62,in_stack_fffffffffffffb60),
                         in_stack_fffffffffffffb5c);
    uVar2 = local_28;
    if (iVar3 != 0) {
      return 1;
    }
    dVar4 = ceil(local_a0 / local_98);
    local_74 = ARKodeSetMaxNumSteps(uVar2,(long)dVar4 + 1);
    iVar3 = check_retval(in_stack_fffffffffffffb68,
                         (char *)CONCAT62(in_stack_fffffffffffffb62,in_stack_fffffffffffffb60),
                         in_stack_fffffffffffffb5c);
    if (iVar3 != 0) {
      return 1;
    }
    if (local_7c == 0) {
      local_74 = ARKodeSetFixedStep(local_98,local_28);
    }
    else {
      local_74 = ARKodeSStolerances(local_98,local_28);
      iVar3 = check_retval(in_stack_fffffffffffffb68,
                           (char *)CONCAT62(in_stack_fffffffffffffb62,in_stack_fffffffffffffb60),
                           in_stack_fffffffffffffb5c);
      if (iVar3 != 0) {
        return 1;
      }
    }
  }
  if (local_80 == 0) {
    local_c0 = "ark_kepler_conserved_%s-dt-%.2e.txt";
    local_c8 = "ark_kepler_solution_%s-dt-%.2e.txt";
    local_d0 = "ark_kepler_times_%s-dt-%.2e.txt";
    sprintf(local_1d8,"ark_kepler_conserved_%s-dt-%.2e.txt",local_98,local_90);
    local_58 = fopen(local_1d8,"w+");
    sprintf(local_1d8,local_c8,local_98,local_90);
    local_60 = fopen(local_1d8,"w+");
    sprintf(local_1d8,local_d0,local_98,local_90);
    local_68 = fopen(local_1d8,"w+");
  }
  else {
    local_1e0 = "ark_kepler_conserved_%s-dt-%.2e.txt";
    local_1e8 = "ark_kepler_solution_%s-dt-%.2e.txt";
    local_1f0 = "ark_kepler_times_%s-dt-%.2e.txt";
    sprintf(local_2f8,"ark_kepler_conserved_%s-dt-%.2e.txt",local_98,local_90);
    local_58 = fopen(local_2f8,"w+");
    sprintf(local_2f8,local_1e8,local_98,local_90);
    local_60 = fopen(local_2f8,"w+");
    sprintf(local_2f8,local_1f0,local_98,local_90);
    local_68 = fopen(local_2f8,"w+");
  }
  local_300 = 0;
  local_308 = local_b0 + 0.0;
  sVar5 = Hamiltonian((N_Vector)CONCAT62(in_stack_fffffffffffffb82,in_stack_fffffffffffffb80));
  sVar6 = AngularMomentum((N_Vector)CONCAT62(in_stack_fffffffffffffb82,in_stack_fffffffffffffb80));
  uVar8 = (undefined2)((unkuint10)(longdouble)sVar6 >> 0x40);
  fprintf(_stdout,"t = %.4Lf, H(p,q) = %.16Lf, L(p,q) = %.16Lf\n");
  fprintf(local_68,"%.16Lf\n");
  fprintf(local_58,"%.16Lf, %.16Lf\n");
  N_VPrintFile(local_30,local_60);
  if (local_80 == 0) {
    while (local_70 < local_88) {
      if (local_10[4] != 0) {
        ARKodeSetStopTime(local_308,local_28);
      }
      local_74 = ARKodeEvolve(local_308,local_28,local_30,&local_300,1);
      pFVar1 = _stdout;
      if (local_74 == 2) {
        local_50 = local_50 + 0.5;
        fprintf(_stdout,"ROOT RETURN:\t");
        ARKodeGetRootInfo(local_28,&local_6c);
        uVar8 = (undefined2)((unkuint10)(longdouble)local_50 >> 0x40);
        fprintf(_stdout,"  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                (ulong)local_6c);
        pFVar1 = _stdout;
        Hamiltonian((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        sVar7 = AngularMomentum((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        uVar8 = (undefined2)((unkuint10)(longdouble)(sVar7 - sVar6) >> 0x40);
        fprintf(pFVar1,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
      }
      else {
        if (local_74 < 0) {
          fprintf(_stderr,"Solver failure, stopping integration\n");
          break;
        }
        Hamiltonian((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        sVar7 = AngularMomentum((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        uVar8 = (undefined2)((unkuint10)(longdouble)(sVar7 - sVar6) >> 0x40);
        fprintf(pFVar1,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
        fprintf(local_68,"%.16Lf\n");
        pFVar1 = local_58;
        Hamiltonian((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        AngularMomentum((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        fprintf(pFVar1,"%.16Lf, %.16Lf\n");
        N_VPrintFile(local_30,local_60);
        local_400 = local_b0 + local_308;
        if (local_a0 < local_400) {
          local_400 = local_a0;
        }
        local_308 = local_400;
        local_70 = local_70 + 1;
      }
    }
  }
  else {
    while (local_70 < local_88) {
      if (local_10[4] != 0) {
        ARKodeSetStopTime(local_308,local_28);
      }
      local_74 = ARKodeEvolve(local_308,local_28,local_30,&local_300,1);
      pFVar1 = _stdout;
      if (local_74 == 2) {
        local_50 = local_50 + 0.5;
        fprintf(_stdout,"ROOT RETURN:\t");
        ARKodeGetRootInfo(local_28,&local_6c);
        uVar8 = (undefined2)((unkuint10)(longdouble)local_50 >> 0x40);
        fprintf(_stdout,"  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                (ulong)local_6c);
        pFVar1 = _stdout;
        Hamiltonian((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        sVar7 = AngularMomentum((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        uVar8 = (undefined2)((unkuint10)(longdouble)(sVar7 - sVar6) >> 0x40);
        fprintf(pFVar1,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
      }
      else {
        if (local_74 < 0) {
          fprintf(_stderr,"Solver failure, stopping integration\n");
          break;
        }
        Hamiltonian((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        sVar7 = AngularMomentum((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        uVar8 = (undefined2)((unkuint10)(longdouble)(sVar7 - sVar6) >> 0x40);
        fprintf(pFVar1,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
        fprintf(local_68,"%.16Lf\n");
        pFVar1 = local_58;
        Hamiltonian((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        AngularMomentum((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
        fprintf(pFVar1,"%.16Lf, %.16Lf\n");
        N_VPrintFile(local_30,local_60);
        local_470 = local_b0 + local_308;
        if (local_a0 < local_470) {
          local_470 = local_a0;
        }
        local_308 = local_470;
        local_70 = local_70 + 1;
      }
    }
  }
  N_VScale(0x3ff0000000000000,local_30,*local_18);
  sVar6 = Hamiltonian((N_Vector)CONCAT62(in_stack_fffffffffffffb82,uVar8));
  local_18[1] = sVar6 - sVar5;
  free(local_40);
  fclose(local_68);
  fclose(local_58);
  fclose(local_60);
  if (local_38 != 0) {
    SUNNonlinSolFree(local_38);
  }
  N_VDestroy(local_30);
  ARKodePrintAllStats(local_28,_stdout,0);
  ARKodeFree(&local_28);
  return 0;
}

Assistant:

int SolveProblem(ProgramArgs* args, ProblemResult* result, SUNContext sunctx)
{
  void* arkode_mem       = NULL;
  N_Vector y             = NULL;
  SUNNonlinearSolver NLS = NULL;
  UserData udata         = NULL;
  sunrealtype* ydata     = NULL;
  sunrealtype num_orbits = 0;
  FILE* conserved_fp     = NULL;
  FILE* solution_fp      = NULL;
  FILE* times_fp         = NULL;
  int rootsfound         = 0;
  int iout               = 0;
  int retval             = 0;

  const int count_orbits     = args->count_orbits;
  const int step_mode        = args->step_mode;
  const int stepper          = args->stepper;
  const int use_compsums     = args->use_compsums;
  const int num_output_times = args->num_output_times;
  const char* method_name    = args->method_name;
  const sunrealtype dt       = args->dt;
  sunrealtype Tf             = args->tf;

  /* Default problem parameters */
  const sunrealtype T0    = SUN_RCONST(0.0);
  const sunrealtype dTout = (Tf - T0) / ((sunrealtype)num_output_times);
  const sunrealtype ecc   = SUN_RCONST(0.6);

  printf("\n   Begin Kepler Problem\n\n");
  PrintArgs(args);

  /* Allocate and fill udata structure */
  udata      = (UserData)malloc(sizeof(*udata));
  udata->ecc = ecc;

  /* Allocate our state vector */
  y     = N_VNew_Serial(4, sunctx);
  ydata = N_VGetArrayPointer(y);

  /* Fill the initial conditions */
  InitialConditions(y, ecc);

  /* Create SPRKStep integrator */
  if (stepper == 0)
  {
    arkode_mem = SPRKStepCreate(force, velocity, T0, y, sunctx);

    /* Optional: enable temporal root-finding */
    if (count_orbits)
    {
      ARKodeRootInit(arkode_mem, 1, rootfn);
      if (check_retval(&retval, "ARKodeRootInit", 1)) { return 1; }
    }

    retval = SPRKStepSetMethodName(arkode_mem, method_name);
    if (check_retval(&retval, "SPRKStepSetMethodName", 1)) { return 1; }

    retval = SPRKStepSetUseCompensatedSums(arkode_mem, use_compsums);
    if (check_retval(&retval, "SPRKStepSetUseCompensatedSums", 1)) { return 1; }

    if (step_mode == 0)
    {
      retval = ARKodeSetFixedStep(arkode_mem, dt);
      if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

      retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 1);
      if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }
    }
    else
    {
      fprintf(stderr,
              "ERROR: adaptive time-steps are not supported with SPRKStep\n");
      return 1;
    }

    retval = ARKodeSetUserData(arkode_mem, (void*)udata);
    if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }
  }
  else if (stepper == 1)
  {
    arkode_mem = ARKStepCreate(dydt, NULL, T0, y, sunctx);

    retval = ARKStepSetTableName(arkode_mem, "ARKODE_DIRK_NONE", method_name);
    if (check_retval(&retval, "ARKStepSetTableName", 1)) { return 1; }

    if (count_orbits)
    {
      ARKodeRootInit(arkode_mem, 1, rootfn);
      if (check_retval(&retval, "ARKodeRootInit", 1)) { return 1; }
    }

    retval = ARKodeSetUserData(arkode_mem, (void*)udata);
    if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

    retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 1);
    if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

    if (step_mode == 0) { retval = ARKodeSetFixedStep(arkode_mem, dt); }
    else
    {
      retval = ARKodeSStolerances(arkode_mem, dt, dt);
      if (check_retval(&retval, "ARKodeSStolerances", 1)) { return 1; }
    }
  }

  /* Open output files */
  if (stepper == 0)
  {
    const char* fmt1 = "ark_kepler_conserved_%s-dt-%.2e.txt";
    const char* fmt2 = "ark_kepler_solution_%s-dt-%.2e.txt";
    const char* fmt3 = "ark_kepler_times_%s-dt-%.2e.txt";
    char fname[256];
    sprintf(fname, fmt1, method_name, dt);
    conserved_fp = fopen(fname, "w+");
    sprintf(fname, fmt2, method_name, dt);
    solution_fp = fopen(fname, "w+");
    sprintf(fname, fmt3, method_name, dt);
    times_fp = fopen(fname, "w+");
  }
  else
  {
    const char* fmt1 = "ark_kepler_conserved_%s-dt-%.2e.txt";
    const char* fmt2 = "ark_kepler_solution_%s-dt-%.2e.txt";
    const char* fmt3 = "ark_kepler_times_%s-dt-%.2e.txt";
    char fname[256];
    sprintf(fname, fmt1, method_name, dt);
    conserved_fp = fopen(fname, "w+");
    sprintf(fname, fmt2, method_name, dt);
    solution_fp = fopen(fname, "w+");
    sprintf(fname, fmt3, method_name, dt);
    times_fp = fopen(fname, "w+");
  }

  /* Print out starting energy, momentum before integrating */
  sunrealtype tret = T0;
  sunrealtype tout = T0 + dTout;
  sunrealtype H0   = Hamiltonian(y);
  sunrealtype L0   = AngularMomentum(y);
  fprintf(stdout, "t = %.4Lf, H(p,q) = %.16Lf, L(p,q) = %.16Lf\n",
          (long double)tret, (long double)H0, (long double)L0);
  fprintf(times_fp, "%.16Lf\n", (long double)tret);
  fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)H0, (long double)L0);
  N_VPrintFile(y, solution_fp);

  /* Do integration */
  if (stepper == 0)
  {
    while (iout < num_output_times)
    {
      /* Optional: if the stop time is not set, then its possible that the
         exact requested output time will not be hit (even with a fixed
         time-step due to roundoff error accumulation) and interpolation will be
         used to get the solution at the output time. */
      if (args->use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
      retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

      if (retval == ARK_ROOT_RETURN)
      {
        num_orbits += SUN_RCONST(0.5);

        fprintf(stdout, "ROOT RETURN:\t");
        ARKodeGetRootInfo(arkode_mem, &rootsfound);
        fprintf(stdout, "  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                rootsfound, (long double)ydata[0], (long double)ydata[1],
                (long double)num_orbits);
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
      }
      else if (retval >= 0)
      {
        /* Output current integration status */
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
        fprintf(times_fp, "%.16Lf\n", (long double)tret);
        fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)Hamiltonian(y),
                (long double)AngularMomentum(y));

        N_VPrintFile(y, solution_fp);

        tout += dTout;
        tout = (tout > Tf) ? Tf : tout;
        iout++;
      }
      else
      {
        fprintf(stderr, "Solver failure, stopping integration\n");
        break;
      }
    }
  }
  else
  {
    while (iout < num_output_times)
    {
      /* Optional: if the stop time is not set, then its possible that the the
         exact requested output time will not be hit (even with a fixed
         time-step due to roundoff error accumulation) and interpolation will be
         used to get the solution at the output time. */
      if (args->use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
      retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

      if (retval == ARK_ROOT_RETURN)
      {
        num_orbits += SUN_RCONST(0.5);

        fprintf(stdout, "ROOT RETURN:\t");
        ARKodeGetRootInfo(arkode_mem, &rootsfound);
        fprintf(stdout, "  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                rootsfound, (long double)ydata[0], (long double)ydata[1],
                (long double)num_orbits);
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
      }
      else if (retval >= 0)
      {
        /* Output current integration status */
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
        fprintf(times_fp, "%.16Lf\n", (long double)tret);
        fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)Hamiltonian(y),
                (long double)AngularMomentum(y));

        N_VPrintFile(y, solution_fp);

        tout += dTout;
        tout = (tout > Tf) ? Tf : tout;
        iout++;
      }
      else
      {
        fprintf(stderr, "Solver failure, stopping integration\n");
        break;
      }
    }
  }

  /* Copy results */
  N_VScale(SUN_RCONST(1.0), y, result->sol);
  result->energy_error = Hamiltonian(y) - H0;

  free(udata);
  fclose(times_fp);
  fclose(conserved_fp);
  fclose(solution_fp);
  if (NLS) { SUNNonlinSolFree(NLS); }
  N_VDestroy(y);
  ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  ARKodeFree(&arkode_mem);
  return 0;
}